

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::StructDatePart::Function<duckdb::interval_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  pointer pplVar1;
  undefined8 *puVar2;
  value_type vVar3;
  idx_t count;
  pointer puVar4;
  unsigned_long *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  byte bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  BoundFunctionExpression *pBVar10;
  pointer pFVar11;
  reference this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar12;
  reference pvVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  reference ppdVar16;
  reference pvVar17;
  pointer pVVar18;
  type pVVar19;
  long lVar20;
  ulong uVar21;
  size_type sVar22;
  value_type pdVar23;
  size_type sVar24;
  idx_t entry_idx;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_entry;
  part_codes_t *part_codes;
  pointer puVar25;
  ulong uVar26;
  int iVar28;
  undefined1 auVar27 [16];
  int iVar29;
  idx_t last_entry_index;
  vector<unsigned_long,_true> owners;
  UnifiedVectorFormat rdata;
  undefined1 local_f8 [16];
  buffer_ptr<ValidityBuffer> *local_e8;
  idx_t local_e0;
  undefined1 local_d8 [16];
  pointer local_c8;
  part_mask_t local_b8;
  vector<double_*,_true> local_b0;
  vector<long_*,_true> local_98;
  data_ptr_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar10 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar11 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar10->bind_info);
  count = args->count;
  this = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_98.super_vector<long_*,_std::allocator<long_*>_>.
  super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0xb0);
  pplVar1 = local_98.super_vector<long_*,_std::allocator<long_*>_>.
            super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data.
            _M_start + 0x16;
  local_98.super_vector<long_*,_std::allocator<long_*>_>.
  super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pplVar1;
  switchD_012e3010::default
            (local_98.super_vector<long_*,_std::allocator<long_*>_>.
             super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data.
             _M_start,0,0xb0);
  local_98.super_vector<long_*,_std::allocator<long_*>_>.
  super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data._M_finish =
       pplVar1;
  local_b0.super_vector<double_*,_std::allocator<double_*>_>.
  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x10);
  local_b0.super_vector<double_*,_std::allocator<double_*>_>.
  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)((long)local_b0.super_vector<double_*,_std::allocator<double_*>_>.
                         super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x10);
  *(undefined1 (*) [16])
   local_b0.super_vector<double_*,_std::allocator<double_*>_>.
   super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data._M_start
       = (undefined1  [16])0x0;
  part_codes = (part_codes_t *)(pFVar11 + 4);
  local_b0.super_vector<double_*,_std::allocator<double_*>_>.
  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_b0.super_vector<double_*,_std::allocator<double_*>_>.
       super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_b8 = DatePart::StructOperator::GetMask(part_codes);
  this_00 = StructVector::GetEntries(result);
  puVar25 = (this_00->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this_00->
           super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (pointer)0x0;
  local_d8._0_8_ = operator_new(0xc0);
  uVar21 = (long)puVar4 - (long)puVar25;
  local_c8 = (pointer)(local_d8._0_8_ + 0xc0);
  iVar28 = (int)(uVar21 >> 0x20);
  iVar29 = iVar28 >> 3;
  auVar27._8_4_ = (int)uVar21;
  auVar27._0_8_ = uVar21;
  auVar27._12_4_ = iVar28;
  lVar20 = 0;
  do {
    puVar2 = (undefined8 *)(local_d8._0_8_ + lVar20 * 8);
    *puVar2 = CONCAT44(iVar29,(int)(uVar21 >> 3));
    *(int *)(puVar2 + 2) = (int)(auVar27._8_8_ >> 3);
    *(int *)((long)puVar2 + 0x14) = iVar29;
    lVar20 = lVar20 + 2;
  } while (lVar20 != 0x18);
  local_d8._8_8_ = local_c8;
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar22 = 0;
    do {
      pvVar12 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar22);
      vVar3 = *pvVar12;
      pvVar13 = vector<unsigned_long,_true>::operator[]
                          ((vector<unsigned_long,_true> *)local_d8,(ulong)vVar3);
      uVar21 = (long)(this_00->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (*pvVar13 == uVar21) {
        pvVar13 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_d8,(ulong)vVar3);
        *pvVar13 = sVar22;
        uVar21 = (long)(this_00->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this_00->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 < uVar21);
  }
  if (this->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      if ((this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar24 = 0;
        do {
          pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_00,sVar24);
          pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar17);
          ConstantVector::SetNull(pVVar19,false);
          pvVar12 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar24);
          uVar21 = (ulong)*pvVar12;
          pvVar13 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)local_d8,uVar21);
          if (sVar24 == *pvVar13) {
            pvVar12 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar24);
            if (*pvVar12 < BEGIN_DOUBLE) {
              pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar17);
              pdVar23 = (value_type)pVVar19->data;
              ppdVar16 = (reference)vector<long_*,_true>::operator[](&local_98,uVar21);
            }
            else {
              pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar17);
              pdVar23 = (value_type)pVVar19->data;
              ppdVar16 = vector<double_*,_true>::operator[](&local_b0,uVar21 - 0x16);
            }
            *ppdVar16 = pdVar23;
          }
          sVar24 = sVar24 + 1;
        } while (sVar24 < (ulong)((long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      DatePart::StructOperator::Operation<duckdb::interval_t>
                (&local_98,&local_b0,(interval_t *)this->data,0,local_b8);
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(this,count,&local_78);
    local_80 = local_78.data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    FlatVector::VerifyFlatVector(result);
    puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (count != 0 && puVar5 != (unsigned_long *)0x0) {
      uVar21 = count + 0x3f >> 6;
      if (uVar21 != 1) {
        switchD_012e3010::default(puVar5,0xff,uVar21 * 8 - 8);
      }
      puVar5[uVar21 - 1] =
           puVar5[uVar21 - 1] | -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
    }
    if ((this_00->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_00->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar21 = count + 0x3f >> 6;
      local_e8 = (buffer_ptr<ValidityBuffer> *)(uVar21 * 8 + -8);
      sVar24 = 0;
      do {
        pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_00,sVar24);
        pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar17);
        Vector::SetVectorType(pVVar18,FLAT_VECTOR);
        pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar17);
        FlatVector::VerifyFlatVector(pVVar19);
        puVar5 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 != (unsigned_long *)0x0 && count != 0) {
          if (uVar21 != 1) {
            switchD_012e3010::default(puVar5,0xff,(size_t)local_e8);
          }
          puVar5[uVar21 - 1] =
               puVar5[uVar21 - 1] | -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
        }
        pvVar12 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar24);
        uVar26 = (ulong)*pvVar12;
        pvVar13 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_d8,uVar26);
        if (sVar24 == *pvVar13) {
          pvVar12 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar24);
          if (*pvVar12 < BEGIN_DOUBLE) {
            pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            pdVar23 = (value_type)pVVar19->data;
            ppdVar16 = (reference)vector<long_*,_true>::operator[](&local_98,uVar26);
          }
          else {
            pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            pdVar23 = (value_type)pVVar19->data;
            ppdVar16 = vector<double_*,_true>::operator[](&local_b0,uVar26 - 0x16);
          }
          *ppdVar16 = pdVar23;
        }
        sVar24 = sVar24 + 1;
      } while (sVar24 < (ulong)((long)(this_00->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (count != 0) {
      local_e8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar21 = 0;
      do {
        uVar26 = uVar21;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar26 = (ulong)(local_78.sel)->sel_vector[uVar21];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar26 >> 6]
             >> (uVar26 & 0x3f) & 1) != 0)) {
          DatePart::StructOperator::Operation<duckdb::interval_t>
                    (&local_98,&local_b0,(interval_t *)(local_80 + uVar26 * 0x10),uVar21,local_b8);
        }
        else {
          _Var15._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var15._M_head_impl == (unsigned_long *)0x0) {
            local_e0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_f8,&local_e0);
            uVar8 = local_f8._0_8_;
            uVar9 = local_f8._8_8_;
            local_f8 = (undefined1  [16])0x0;
            p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar8;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
              }
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_e8);
            _Var15._M_head_impl =
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var15._M_head_impl;
          }
          bVar7 = (byte)uVar21 & 0x3f;
          uVar26 = -2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7;
          _Var15._M_head_impl[uVar21 >> 6] = _Var15._M_head_impl[uVar21 >> 6] & uVar26;
          puVar4 = (this_00->
                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar25 = (this_00->
                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar4;
              puVar25 = puVar25 + 1) {
            pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(puVar25);
            FlatVector::VerifyFlatVector(pVVar19);
            _Var15._M_head_impl =
                 (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var15._M_head_impl == (unsigned_long *)0x0) {
              local_e0 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_f8,&local_e0);
              uVar8 = local_f8._0_8_;
              uVar9 = local_f8._8_8_;
              local_f8 = (undefined1  [16])0x0;
              p_Var6 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)uVar8;
              (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                }
              }
              pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var15._M_head_impl =
                   (pTVar14->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var15._M_head_impl;
            }
            _Var15._M_head_impl[uVar21 >> 6] = _Var15._M_head_impl[uVar21 >> 6] & uVar26;
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != count);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar22 = 0;
    do {
      pvVar12 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar22);
      pvVar13 = vector<unsigned_long,_true>::operator[]
                          ((vector<unsigned_long,_true> *)local_d8,(ulong)*pvVar12);
      sVar24 = *pvVar13;
      if (sVar22 != sVar24) {
        pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_00,sVar22);
        pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar17);
        pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_00,sVar24);
        pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar17);
        Vector::Reference(pVVar18,pVVar19);
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 < (ulong)((long)(this_00->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  Vector::Verify(result,count);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((undefined1 (*) [16])
      local_b0.super_vector<double_*,_std::allocator<double_*>_>.
      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (undefined1 (*) [16])0x0) {
    operator_delete(local_b0.super_vector<double_*,_std::allocator<double_*>_>.
                    super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super_vector<long_*,_std::allocator<long_*>_>.
      super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_98.super_vector<long_*,_std::allocator<long_*>_>.
                    super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void Function(DataChunk &args, ExpressionState &state, Vector &result) {
		auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
		auto &info = func_expr.bind_info->Cast<BindData>();
		D_ASSERT(args.ColumnCount() == 1);

		const auto count = args.size();
		Vector &input = args.data[0];

		//	Type counts
		const auto BIGINT_COUNT = size_t(DatePartSpecifier::BEGIN_DOUBLE) - size_t(DatePartSpecifier::BEGIN_BIGINT);
		const auto DOUBLE_COUNT = size_t(DatePartSpecifier::BEGIN_INVALID) - size_t(DatePartSpecifier::BEGIN_DOUBLE);
		DatePart::StructOperator::bigint_vec bigint_values(BIGINT_COUNT, nullptr);
		DatePart::StructOperator::double_vec double_values(DOUBLE_COUNT, nullptr);
		const auto part_mask = DatePart::StructOperator::GetMask(info.part_codes);

		auto &child_entries = StructVector::GetEntries(result);

		// The first computer of a part "owns" it
		// and other requestors just reference the owner
		vector<size_t> owners(int(DatePartSpecifier::JULIAN_DAY) + 1, child_entries.size());
		for (size_t col = 0; col < child_entries.size(); ++col) {
			const auto part_index = size_t(info.part_codes[col]);
			if (owners[part_index] == child_entries.size()) {
				owners[part_index] = col;
			}
		}

		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				for (size_t col = 0; col < child_entries.size(); ++col) {
					auto &child_entry = child_entries[col];
					ConstantVector::SetNull(*child_entry, false);
					const auto part_index = size_t(info.part_codes[col]);
					if (owners[part_index] == col) {
						if (IsBigintDatepart(info.part_codes[col])) {
							bigint_values[part_index - size_t(DatePartSpecifier::BEGIN_BIGINT)] =
							    ConstantVector::GetData<int64_t>(*child_entry);
						} else {
							double_values[part_index - size_t(DatePartSpecifier::BEGIN_DOUBLE)] =
							    ConstantVector::GetData<double>(*child_entry);
						}
					}
				}
				auto tdata = ConstantVector::GetData<INPUT_TYPE>(input);
				if (Value::IsFinite(tdata[0])) {
					DatePart::StructOperator::Operation(bigint_values, double_values, tdata[0], 0, part_mask);
				} else {
					for (auto &child_entry : child_entries) {
						ConstantVector::SetNull(*child_entry, true);
					}
				}
			}
		} else {
			UnifiedVectorFormat rdata;
			input.ToUnifiedFormat(count, rdata);

			const auto &arg_valid = rdata.validity;
			auto tdata = UnifiedVectorFormat::GetData<INPUT_TYPE>(rdata);

			// Start with a valid flat vector
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto &res_valid = FlatVector::Validity(result);
			if (res_valid.GetData()) {
				res_valid.SetAllValid(count);
			}

			// Start with valid children
			for (size_t col = 0; col < child_entries.size(); ++col) {
				auto &child_entry = child_entries[col];
				child_entry->SetVectorType(VectorType::FLAT_VECTOR);
				auto &child_validity = FlatVector::Validity(*child_entry);
				if (child_validity.GetData()) {
					child_validity.SetAllValid(count);
				}

				// Pre-multiplex
				const auto part_index = size_t(info.part_codes[col]);
				if (owners[part_index] == col) {
					if (IsBigintDatepart(info.part_codes[col])) {
						bigint_values[part_index - size_t(DatePartSpecifier::BEGIN_BIGINT)] =
						    FlatVector::GetData<int64_t>(*child_entry);
					} else {
						double_values[part_index - size_t(DatePartSpecifier::BEGIN_DOUBLE)] =
						    FlatVector::GetData<double>(*child_entry);
					}
				}
			}

			for (idx_t i = 0; i < count; ++i) {
				const auto idx = rdata.sel->get_index(i);
				if (arg_valid.RowIsValid(idx)) {
					if (Value::IsFinite(tdata[idx])) {
						DatePart::StructOperator::Operation(bigint_values, double_values, tdata[idx], i, part_mask);
					} else {
						for (auto &child_entry : child_entries) {
							FlatVector::Validity(*child_entry).SetInvalid(i);
						}
					}
				} else {
					res_valid.SetInvalid(i);
					for (auto &child_entry : child_entries) {
						FlatVector::Validity(*child_entry).SetInvalid(i);
					}
				}
			}
		}

		// Reference any duplicate parts
		for (size_t col = 0; col < child_entries.size(); ++col) {
			const auto part_index = size_t(info.part_codes[col]);
			const auto owner = owners[part_index];
			if (owner != col) {
				child_entries[col]->Reference(*child_entries[owner]);
			}
		}

		result.Verify(count);
	}